

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

int __thiscall
ON_PolyCurve::GetNurbForm(ON_PolyCurve *this,ON_NurbsCurve *nurb,double tol,ON_Interval *subdomain)

{
  ulong uVar1;
  uint uVar2;
  double *pdVar3;
  ON_Curve *pOVar4;
  _func_int *p_Var5;
  ON_3dPoint start_point;
  long lVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  double extraout_XMM0_Qa;
  double dVar16;
  double in_XMM1_Qa;
  ON_Interval domain;
  ON_3dPoint P;
  ON_NurbsCurve c;
  ON_3dPoint PEnd;
  ON_3dPoint PStart;
  ON_Interval local_108;
  ON_Interval *local_f0;
  double local_e8;
  ulong local_e0;
  long local_d8;
  ON_3dPoint local_d0;
  ON_NurbsCurve local_b8;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  local_e8 = tol;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  local_108.m_t[0] = extraout_XMM0_Qa;
  local_108.m_t[1] = in_XMM1_Qa;
  bVar7 = ON_Interval::IsIncreasing(&local_108);
  if (!bVar7) {
    return 0;
  }
  uVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  lVar12 = (long)(int)uVar2;
  if (subdomain != (ON_Interval *)0x0) {
    bVar7 = ON_Interval::IsIncreasing(subdomain);
    if (!bVar7) {
      return 0;
    }
    dVar16 = ON_Interval::Min(subdomain);
    bVar7 = ON_Interval::Includes(&local_108,dVar16,false);
    if (!bVar7) {
      return 0;
    }
    dVar16 = ON_Interval::Max(subdomain);
    bVar7 = ON_Interval::Includes(&local_108,dVar16,false);
    if (!bVar7) {
      return 0;
    }
    local_108.m_t[0] = subdomain->m_t[0];
    local_108.m_t[1] = subdomain->m_t[1];
  }
  pdVar3 = (this->m_t).m_a;
  uVar10 = 0;
  uVar15 = 0;
  if (0 < (int)uVar2) {
    uVar15 = (ulong)uVar2;
  }
  do {
    if (uVar15 == uVar10) goto LAB_00596d49;
    uVar1 = uVar10 + 1;
    lVar11 = uVar10 + 1;
    uVar10 = uVar1;
  } while (pdVar3[lVar11] <= local_108.m_t[0]);
  uVar15 = (ulong)((int)uVar1 - 1);
LAB_00596d49:
  lVar11 = (long)(int)uVar15;
  lVar13 = (lVar12 << 0x20) + 0x100000000;
  do {
    if (lVar12 <= lVar11) {
      return 0;
    }
    lVar6 = lVar12 + -1;
    lVar12 = lVar12 + -1;
    lVar13 = lVar13 + -0x100000000;
  } while (local_108.m_t[1] <= pdVar3[lVar6]);
  local_f0 = subdomain;
  ON_NurbsCurve::ON_NurbsCurve(&local_b8);
  local_d8 = 0;
  local_e0 = uVar15;
  iVar14 = 0;
  do {
    iVar9 = iVar14;
    if ((lVar13 >> 0x20 <= lVar11) ||
       (pOVar4 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar11], iVar9 = 0,
       pOVar4 == (ON_Curve *)0x0)) goto LAB_00596f52;
    p_Var5 = (pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3f];
    bVar7 = local_d8 == 0;
    local_d8 = local_d8 + -1;
    if (bVar7) {
      iVar8 = (*p_Var5)(local_e8,pOVar4,nurb,0);
      iVar9 = iVar8;
      iVar14 = iVar8;
      if (iVar8 < 1) goto LAB_00596f52;
      pdVar3 = (this->m_t).m_a;
      (*(nurb->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (pdVar3[local_e0],pdVar3[local_e0 + 1]);
    }
    else {
      iVar9 = (*p_Var5)(local_e8,pOVar4,&local_b8,0);
      if (iVar9 < 1) {
LAB_00596f52:
        ON_NurbsCurve::~ON_NurbsCurve(&local_b8);
        if ((local_f0 != (ON_Interval *)0x0) && (lVar13 >> 0x20 <= lVar11)) {
          (*(nurb->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3c])
                    (nurb,local_f0);
          iVar9 = iVar14;
        }
        return iVar9;
      }
      iVar8 = iVar9;
      if (iVar9 < iVar14) {
        iVar8 = iVar14;
      }
      pdVar3 = (this->m_t).m_a;
      ON_NurbsCurve::SetDomain(&local_b8,pdVar3[lVar11],pdVar3[lVar11 + 1]);
      ON_Curve::PointAtEnd(&local_78,&nurb->super_ON_Curve);
      ON_Curve::PointAtStart(&local_48,&local_b8.super_ON_Curve);
      ON_3dPoint::operator+(&local_60,&local_78,&local_48);
      ::operator*(&local_d0,0.5,&local_60);
      (*(nurb->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])();
      start_point.y = local_d0.y;
      start_point.x = local_d0.x;
      start_point.z = local_d0.z;
      ON_NurbsCurve::SetStartPoint(&local_b8,start_point);
      bVar7 = ON_NurbsCurve::Append(nurb,&local_b8);
      iVar9 = 0;
      iVar14 = iVar8;
      if (!bVar7) goto LAB_00596f52;
      ON_NurbsCurve::Destroy(&local_b8);
    }
    lVar11 = lVar11 + 1;
    iVar14 = iVar8;
  } while( true );
}

Assistant:

int ON_PolyCurve::GetNurbForm( 
                              ON_NurbsCurve& nurb, 
                              double tol,
                              const ON_Interval* subdomain  // OPTIONAL subdomain of ON::ProxyCurve::Domain()
                              ) const
{
  ON_Interval domain = Domain();
  if ( !domain.IsIncreasing() )
    return false;
  int rc = 0;
  int si0 = 0;
  int si1 = Count();
  if ( subdomain ) {
    if ( !subdomain->IsIncreasing() )
      return 0;
    if ( !domain.Includes(subdomain->Min()) )
      return 0;
    if ( !domain.Includes(subdomain->Max()) )
      return 0;
    domain = *subdomain;
  }

  while ( si0 < si1 && m_t[si0+1] <= domain.m_t[0] )
    si0++;
  while ( si0 < si1 && m_t[si1-1] >= domain.m_t[1] )
    si1--;
  if ( si0 >= si1 )
    return 0;
  {
    ON_NurbsCurve c;
    int i, rci;
    for ( i = si0; i < si1; i++ ) {
      if ( !m_segment[i] )
        return 0;
      if ( i == si0 ) {
        rc = m_segment[i]->GetNurbForm( nurb, tol, nullptr );
        if ( rc < 1 )
          return rc;
        nurb.SetDomain( m_t[i], m_t[i+1] );
      }
      else {
        rci = m_segment[i]->GetNurbForm( c, tol, nullptr );
        if ( rci < 1 )
          return rci;
        else if ( rc < rci )
          rc = rci;
        c.SetDomain( m_t[i], m_t[i+1] );
        ON_3dPoint PEnd = nurb.PointAtEnd();
        ON_3dPoint PStart = c.PointAtStart();
        ON_3dPoint P = 0.5*(PEnd+PStart);
        nurb.SetEndPoint(P);
        c.SetStartPoint(P);
        if ( !nurb.Append( c ) )
          return 0;
        c.Destroy();
      }
    }
  }

  if ( subdomain )
    nurb.Trim( *subdomain );

  return rc;
}